

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_node_tec_block
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,
          int dataformat,FILE *file)

{
  REF_MPI ref_mpi;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  REF_INT *sorted_index;
  REF_GLOB *original;
  void *pvVar5;
  void *output;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  REF_DBL *pRVar9;
  undefined8 uVar10;
  uint n;
  REF_STATUS ref_private_macro_code_rxs;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  uint n_00;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  float single_float;
  REF_INT position;
  uint local_94;
  float local_60;
  int local_5c;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  REF_DBL *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  iVar4 = ref_node->max;
  lVar14 = (long)iVar4;
  if (lVar14 < 1) {
    uVar2 = 0;
  }
  else {
    lVar13 = 0;
    uVar2 = 0;
    do {
      if (l2c[lVar13] != -1) {
        uVar2 = uVar2 + (ref_mpi->id == ref_node->part[lVar13]);
      }
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
    if ((int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xff
             ,"ref_gather_node_tec_block","malloc sorted_local of REF_INT negative");
      return 1;
    }
  }
  sVar11 = (ulong)uVar2 * 4;
  local_50 = nnode;
  local_38 = scalar;
  sorted_index = (REF_INT *)malloc(sVar11);
  if (sorted_index == (REF_INT *)0x0) {
    pcVar12 = "malloc sorted_local of REF_INT NULL";
    uVar10 = 0xff;
  }
  else {
    original = (REF_GLOB *)malloc((ulong)uVar2 << 3);
    if (original == (REF_GLOB *)0x0) {
      pcVar12 = "malloc sorted_cellnode of REF_GLOB NULL";
      uVar10 = 0x100;
    }
    else {
      pvVar5 = malloc(sVar11);
      if (pvVar5 == (void *)0x0) {
        pcVar12 = "malloc pack of REF_INT NULL";
        uVar10 = 0x101;
      }
      else {
        if (iVar4 < 1) {
          n = 0;
          uVar2 = ref_sort_heap_glob(0,original,sorted_index);
          if (uVar2 != 0) goto LAB_001442ea;
        }
        else {
          lVar13 = 0;
          n = 0;
          do {
            if ((l2c[lVar13] != -1) && (ref_mpi->id == ref_node->part[lVar13])) {
              original[(int)n] = l2c[lVar13];
              *(int *)((long)pvVar5 + (long)(int)n * 4) = (int)lVar13;
              n = n + 1;
            }
            lVar13 = lVar13 + 1;
          } while (lVar14 != lVar13);
          uVar2 = ref_sort_heap_glob(n,original,sorted_index);
          if (uVar2 != 0) {
LAB_001442ea:
            pcVar12 = "sort";
            uVar10 = 0x10c;
LAB_0014430d:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar10,"ref_gather_node_tec_block",(ulong)uVar2,pcVar12);
            return uVar2;
          }
          if (0 < (int)n) {
            uVar8 = 0;
            do {
              iVar4 = *(int *)((long)pvVar5 + (long)sorted_index[uVar8] * 4);
              sorted_index[uVar8] = iVar4;
              original[uVar8] = l2c[iVar4];
              uVar8 = uVar8 + 1;
            } while (n != uVar8);
          }
        }
        free(pvVar5);
        sVar11 = local_50;
        uVar3 = (int)((long)local_50 / (long)ref_mpi->n) + 1;
        uVar2 = 100000;
        if (100000 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = 0x7fffffff;
        if (0 < ref_mpi->reduce_byte_limit) {
          uVar3 = (uint)ref_mpi->reduce_byte_limit >> 3;
        }
        if ((int)uVar3 <= (int)uVar2) {
          uVar2 = uVar3;
        }
        uVar8 = (ulong)uVar2;
        pvVar5 = malloc(uVar8 * 8);
        if (pvVar5 == (void *)0x0) {
          pcVar12 = "malloc local_xyzm of REF_DBL NULL";
          uVar10 = 0x118;
        }
        else {
          output = malloc(uVar8 * 8);
          if (output != (void *)0x0) {
            if (-3 < ldim) {
              local_48 = (ulong)(uVar2 - 1) * 8 + 8;
              uVar7 = ldim + 2;
              if ((int)uVar7 < 1) {
                uVar7 = 0;
              }
              local_94 = 0;
              local_40 = uVar8;
              uVar1 = 0;
              do {
                if ((long)sVar11 < 1) {
                  sVar6 = 0;
                }
                else {
                  sVar6 = 0;
                  do {
                    uVar15 = sVar11 - sVar6;
                    if ((long)uVar8 <= (long)(sVar11 - sVar6)) {
                      uVar15 = uVar8;
                    }
                    if (uVar3 != 0) {
                      memset(pvVar5,0,local_48);
                    }
                    n_00 = (uint)uVar15;
                    local_58 = sVar6;
                    if (0 < (int)n_00) {
                      uVar8 = 0;
                      do {
                        uVar2 = ref_sort_search_glob(n,original,local_58 + uVar8,&local_5c);
                        if ((uVar2 != 0) && (uVar2 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x129,"ref_gather_node_tec_block",(ulong)uVar2,"node local failed"
                                );
                          local_94 = uVar2;
                        }
                        if (uVar2 != 5) {
                          if (uVar2 != 0) {
                            return local_94;
                          }
                          if (uVar1 < 3) {
                            iVar4 = sorted_index[local_5c] * 0xf + uVar1;
                            pRVar9 = ref_node->real;
                          }
                          else {
                            iVar4 = sorted_index[local_5c] * ldim + (uVar1 - 3);
                            pRVar9 = local_38;
                          }
                          *(REF_DBL *)((long)pvVar5 + uVar8 * 8) = pRVar9[iVar4];
                        }
                        uVar8 = uVar8 + 1;
                      } while ((n_00 & 0x7fffffff) != uVar8);
                    }
                    uVar2 = ref_mpi_sum(ref_mpi,pvVar5,output,n_00,3);
                    if (uVar2 != 0) {
                      pcVar12 = "sum";
                      uVar10 = 0x134;
                      goto LAB_0014430d;
                    }
                    sVar11 = (size_t)(int)n_00;
                    if (ref_mpi->id == 0) {
                      if (dataformat == 2) {
                        sVar6 = fwrite(output,8,sVar11,(FILE *)file);
                        if (sVar11 != sVar6) {
                          pcVar12 = "block chunk";
                          uVar10 = 0x142;
                          goto LAB_001446aa;
                        }
                      }
                      else {
                        if (dataformat != 1) {
                          return 6;
                        }
                        if (0 < (int)n_00) {
                          uVar8 = 0;
                          do {
                            local_60 = (float)*(double *)((long)output + uVar8 * 8);
                            sVar6 = fwrite(&local_60,4,1,(FILE *)file);
                            if (sVar6 != 1) {
                              pcVar12 = "single float";
                              sVar11 = 1;
                              uVar10 = 0x13d;
                              goto LAB_001446aa;
                            }
                            uVar8 = uVar8 + 1;
                          } while ((n_00 & 0x7fffffff) != uVar8);
                        }
                      }
                    }
                    sVar6 = local_58 + sVar11;
                    uVar8 = local_40;
                    sVar11 = local_50;
                  } while ((long)sVar6 < (long)local_50);
                }
                if (sVar6 != sVar11) {
                  pcVar12 = "node miscount";
                  uVar10 = 0x149;
LAB_001446aa:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar10,"ref_gather_node_tec_block",pcVar12,sVar11,sVar6);
                  return 1;
                }
                bVar16 = uVar1 != uVar7;
                uVar1 = uVar1 + 1;
              } while (bVar16);
            }
            free(output);
            free(pvVar5);
            free(original);
            free(sorted_index);
            return 0;
          }
          pcVar12 = "malloc xyzm of REF_DBL NULL";
          uVar10 = 0x119;
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar10,
         "ref_gather_node_tec_block",pcVar12);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_block(
    REF_NODE ref_node, REF_GLOB nnode, REF_GLOB *l2c, REF_INT ldim,
    REF_DBL *scalar, int dataformat, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, ivar;
  REF_STATUS status;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(ref_mpi, (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, chunk, REF_DBL);
  ref_malloc(xyzm, chunk, REF_DBL);

  for (ivar = 0; ivar < 3 + ldim; ivar++) {
    nnode_written = 0;
    while (nnode_written < nnode) {
      first = nnode_written;
      n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

      nnode_written += n;

      for (i = 0; i < chunk; i++) local_xyzm[i] = 0.0;

      for (i = 0; i < n; i++) {
        global = first + i;
        status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                      &position);
        RXS(status, REF_NOT_FOUND, "node local failed");
        if (REF_SUCCESS == status) {
          local = sorted_local[position];
          if (ivar < 3) {
            local_xyzm[i] = ref_node_xyz(ref_node, ivar, local);
          } else {
            local_xyzm[i] = scalar[(ivar - 3) + ldim * local];
          }
        }
      }

      RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, n, REF_DBL_TYPE), "sum");

      if (ref_mpi_once(ref_mpi)) {
        switch (dataformat) {
          case 1:
            for (i = 0; i < n; i++) {
              float single_float;
              single_float = (float)xyzm[i];
              REIS(1, fwrite(&single_float, sizeof(float), 1, file),
                   "single float");
            }
            break;
          case 2:
            REIS(n, fwrite(xyzm, sizeof(double), (unsigned long)n, file),
                 "block chunk");
            break;
          default:
            return REF_IMPLEMENT;
        }
      }
    }
    REIS(nnode, nnode_written, "node miscount");
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}